

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O1

void atombf_d(disctx *ctx,ull *a,ull *m,void *v)

{
  int iVar1;
  ull num;
  ull uVar2;
  easm_expr *peVar3;
  easm_expr *e2;
  litem **pplVar4;
  litem *plVar5;
  int iVar6;
  
  num = getbf((bitfield *)v,a,m);
  uVar2 = getbf((bitfield *)((long)v + 0x30),a,m);
  peVar3 = easm_expr_num(EASM_EXPR_NUM,num);
  e2 = easm_expr_num(EASM_EXPR_NUM,uVar2 + num);
  peVar3 = easm_expr_bin(EASM_EXPR_VEC,peVar3,e2);
  iVar1 = ctx->atomsmax;
  if (iVar1 <= ctx->atomsnum) {
    iVar6 = iVar1 * 2;
    if (iVar1 == 0) {
      iVar6 = 0x10;
    }
    ctx->atomsmax = iVar6;
    pplVar4 = (litem **)realloc(ctx->atoms,(long)iVar6 << 3);
    ctx->atoms = pplVar4;
  }
  plVar5 = (litem *)calloc(0x20,1);
  plVar5->type = LITEM_EXPR;
  plVar5->expr = peVar3;
  iVar1 = ctx->atomsnum;
  ctx->atomsnum = iVar1 + 1;
  ctx->atoms[iVar1] = plVar5;
  return;
}

Assistant:

void atombf_d DPROTO {
	const struct bitfield *bf = v;
	uint64_t num1 = GETBF(&bf[0]);
	uint64_t num2 = num1 + GETBF(&bf[1]);
	struct easm_expr *expr = easm_expr_bin(EASM_EXPR_VEC,
			easm_expr_num(EASM_EXPR_NUM, num1),
			easm_expr_num(EASM_EXPR_NUM, num2));
	ADDARRAY(ctx->atoms, makeli(expr));
}